

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_382ab::mock_writer::mock_writer(mock_writer *this)

{
  function<void_()> local_38;
  descriptor<pstore::details::posix_descriptor_traits> local_18;
  mock_writer *local_10;
  mock_writer *this_local;
  
  local_10 = this;
  make_pipe();
  std::function<void()>::function<void(&)(),void>
            ((function<void()> *)&local_38,pstore::brokerface::writer::default_callback);
  pstore::brokerface::writer::writer(&this->super_writer,(UI *)&local_18,(UI_STRING *)&local_38);
  std::function<void_()>::~function(&local_38);
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&local_18);
  (this->super_writer)._vptr_writer = (_func_int **)&PTR__mock_writer_001e1300;
  testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::FunctionMocker
            (&this->gmock01_write_impl_36);
  return;
}

Assistant:

mock_writer ()
                : pstore::brokerface::writer (make_pipe ()) {}